

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color2.c
# Opt level: O3

void draw_axis(float x,float y,float a,float a2,float l,float tl,char *label,int ticks,
              char *numformat,float num1,float num2,float num)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ALLEGRO_FONT *pAVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double local_c0;
  
  dVar1 = (double)x;
  dVar2 = (double)a;
  dVar3 = cos(dVar2);
  dVar4 = (double)y;
  dVar5 = sin(dVar2);
  al_draw_line(x,y,(float)(dVar3 * 512.0 + dVar1),(float)(dVar5 * -512.0 + dVar4),
               example.white._0_8_,example.white._8_8_,0x3f800000);
  if (0 < ticks) {
    dVar3 = (double)(ticks + -1);
    dVar5 = (double)a2;
    iVar11 = 0;
    local_c0 = 0.0;
    do {
      dVar6 = cos(dVar2);
      fVar12 = (float)((dVar6 * 512.0 * local_c0) / dVar3 + dVar1);
      dVar6 = sin(dVar2);
      fVar13 = (float)(dVar4 - (dVar6 * 512.0 * local_c0) / dVar3);
      dVar6 = (double)fVar12;
      dVar7 = cos(dVar5);
      dVar8 = (double)fVar13;
      dVar9 = sin(dVar5);
      al_draw_line(fVar12,fVar13,(float)(dVar7 * (double)l + dVar6),
                   (float)(dVar9 * -(double)l + dVar8),example.white._0_8_,example.white._8_8_,
                   0x3f800000);
      pAVar10 = example.font;
      dVar7 = cos(dVar5);
      dVar9 = sin(dVar5);
      al_draw_textf(example.white.r,example.white.b,(float)(int)(dVar7 * (double)(l + 2.0) + dVar6),
                    CONCAT44((float)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),
                             (float)(int)(dVar9 * -(double)(l + 2.0) + dVar8)),
                    (double)(((float)iVar11 * (1.0 - tl)) / (float)(ticks + -1) + tl),pAVar10,2,
                    numformat);
      local_c0 = local_c0 + 1.0;
      iVar11 = iVar11 + 1;
    } while (ticks != iVar11);
  }
  dVar6 = (double)(((num1 - tl) * 512.0) / (1.0 - tl));
  dVar3 = cos(dVar2);
  dVar5 = sin(dVar2);
  al_draw_filled_circle
            ((float)(dVar3 * dVar6 + dVar1),(float)(dVar4 - dVar5 * dVar6),0x41000000,
             example.white._0_8_,example.white._8_8_);
  pAVar10 = example.font;
  dVar3 = cos(dVar2);
  dVar2 = sin(dVar2);
  al_draw_textf(example.white.r,example.white.b,(float)((int)(dVar3 * 516.0 + dVar1) + -0x18),
                (float)((int)(dVar2 * -516.0 + dVar4) + -0xc),pAVar10,0,"%s",label);
  return;
}

Assistant:

static void draw_axis(float x, float y, float a, float a2, float l,
      float tl, char const *label, int ticks,
      char const *numformat, float num1, float num2, float num) {
   al_draw_line(x, y, x + l * cos(a), y - l * sin(a), example.white, 1);
   int i;
   for (i = 0; i < ticks; i++) {
      float x2 = x + l * cos(a) * i / (ticks - 1);
      float y2 = y - l * sin(a) * i / (ticks - 1);
      al_draw_line(x2, y2, x2 + tl * cos(a2), y2 - tl * sin(a2), example.white, 1);
      al_draw_textf(example.font, example.white,
         (int)(x2 + (tl + 2) * cos(a2)), (int)(y2 - (tl + 2) * sin(a2)), ALLEGRO_ALIGN_RIGHT, numformat,
         num1 + i * (num2 - num1) / (ticks - 1));
   }
   float lv = (num - num1) * l / (num2 - num1);
   al_draw_filled_circle(x + lv * cos(a), y - lv * sin(a), 8, example.white);
   al_draw_textf(example.font, example.white,
      (int)(x + (l + 4) * cos(a)) - 24, (int)(y - (l + 4) * sin(a)) - 12, 0, "%s", label);
}